

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.cc
# Opt level: O2

void __thiscall
gvr::PointCloud::PointCloud
          (PointCloud *this,PointCloud *p,vector<bool,_std::allocator<bool>_> *vused)

{
  float *pfVar1;
  const_reference cVar2;
  float *pfVar3;
  long lVar4;
  ulong uVar5;
  int i;
  ulong uVar6;
  size_type sVar7;
  int iVar8;
  
  Model::Model(&this->super_Model,&p->super_Model);
  (this->super_Model)._vptr_Model = (_func_int **)&PTR__PointCloud_00173080;
  this->n = 0;
  this->scanpos = (float *)0x0;
  this->vertex = (float *)0x0;
  this->scanprop = (float *)0x0;
  uVar6 = (ulong)(uint)((*(int *)(vused + 0x10) - *(int *)vused) * 8 + *(int *)(vused + 0x18));
  while (0 < (int)uVar6) {
    uVar6 = uVar6 - 1;
    cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](vused,uVar6);
    if (cVar2) {
      this->n = this->n + 1;
    }
  }
  uVar6 = (long)this->n * 0xc;
  if ((long)this->n < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pfVar3 = (float *)operator_new__(uVar6);
  this->vertex = pfVar3;
  lVar4 = 8;
  iVar8 = 0;
  for (sVar7 = 0; uVar6 = (ulong)p->n, (long)sVar7 < (long)uVar6; sVar7 = sVar7 + 1) {
    cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](vused,sVar7);
    if (cVar2) {
      pfVar3 = p->vertex;
      pfVar1 = this->vertex;
      pfVar1[iVar8] = *(float *)((long)pfVar3 + lVar4 + -8);
      pfVar1[(long)iVar8 + 1] = *(float *)((long)pfVar3 + lVar4 + -4);
      pfVar1[(long)iVar8 + 2] = *(float *)((long)pfVar3 + lVar4);
      iVar8 = iVar8 + 3;
    }
    lVar4 = lVar4 + 0xc;
  }
  if (p->scanprop != (float *)0x0) {
    uVar5 = (long)this->n * 0xc;
    if ((long)this->n < 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pfVar3 = (float *)operator_new__(uVar5);
    this->scanprop = pfVar3;
    lVar4 = 8;
    iVar8 = 0;
    for (sVar7 = 0; (long)sVar7 < (long)(int)uVar6; sVar7 = sVar7 + 1) {
      cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](vused,sVar7);
      if (cVar2) {
        pfVar3 = p->scanprop;
        pfVar1 = this->scanprop;
        pfVar1[iVar8] = *(float *)((long)pfVar3 + lVar4 + -8);
        pfVar1[(long)iVar8 + 1] = *(float *)((long)pfVar3 + lVar4 + -4);
        pfVar1[(long)iVar8 + 2] = *(float *)((long)pfVar3 + lVar4);
        iVar8 = iVar8 + 3;
      }
      uVar6 = (ulong)(uint)p->n;
      lVar4 = lVar4 + 0xc;
    }
  }
  if (p->scanpos != (float *)0x0) {
    uVar5 = (long)this->n * 0xc;
    if ((long)this->n < 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pfVar3 = (float *)operator_new__(uVar5);
    this->scanpos = pfVar3;
    lVar4 = 8;
    iVar8 = 0;
    for (sVar7 = 0; (long)sVar7 < (long)(int)uVar6; sVar7 = sVar7 + 1) {
      cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](vused,sVar7);
      if (cVar2) {
        pfVar3 = p->scanpos;
        pfVar1 = this->scanpos;
        pfVar1[iVar8] = *(float *)((long)pfVar3 + lVar4 + -8);
        pfVar1[(long)iVar8 + 1] = *(float *)((long)pfVar3 + lVar4 + -4);
        pfVar1[(long)iVar8 + 2] = *(float *)((long)pfVar3 + lVar4);
        iVar8 = iVar8 + 3;
      }
      uVar6 = (ulong)(uint)p->n;
      lVar4 = lVar4 + 0xc;
    }
  }
  return;
}

Assistant:

PointCloud::PointCloud(const PointCloud &p, const std::vector<bool> &vused) : Model(p)
{
  n=0;
  vertex=0;
  scanprop=0;
  scanpos=0;

  for (int i=static_cast<int>(vused.size())-1; i>=0; i--)
  {
    if (vused[i])
    {
      n++;
    }
  }

  vertex=new float [3*n];

  int k=0;

  for (int i=0; i<p.getVertexCount(); i++)
  {
    if (vused[i])
    {
      vertex[k++]=p.getVertexComp(i, 0);
      vertex[k++]=p.getVertexComp(i, 1);
      vertex[k++]=p.getVertexComp(i, 2);
    }
  }

  if (p.hasScanProp())
  {
    scanprop=new float [3*n];

    k=0;

    for (int i=0; i<p.getVertexCount(); i++)
    {
      if (vused[i])
      {
        scanprop[k++]=p.getScanSize(i);
        scanprop[k++]=p.getScanError(i);
        scanprop[k++]=p.getScanConf(i);
      }
    }
  }

  if (p.hasScanPos())
  {
    scanpos=new float [3*n];

    k=0;

    for (int i=0; i<p.getVertexCount(); i++)
    {
      if (vused[i])
      {
        scanpos[k++]=p.getScanPosComp(i, 0);
        scanpos[k++]=p.getScanPosComp(i, 1);
        scanpos[k++]=p.getScanPosComp(i, 2);
      }
    }
  }
}